

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlFeatures.cpp
# Opt level: O0

GdlExtName * __thiscall GdlFeatureSetting::FindBasicExtName_abi_cxx11_(GdlFeatureSetting *this)

{
  bool bVar1;
  long in_RSI;
  GdlExtName *in_RDI;
  GdlExtName extname;
  iterator __end1;
  iterator __begin1;
  vector<GdlExtName,_std::allocator<GdlExtName>_> *__range1;
  GdlExtName *this_00;
  int in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  GdlExtName *in_stack_ffffffffffffff80;
  wstring local_50 [32];
  short local_30;
  GdlExtName *local_28;
  __normal_iterator<GdlExtName_*,_std::vector<GdlExtName,_std::allocator<GdlExtName>_>_> local_20;
  long local_18;
  
  local_18 = in_RSI + 0x48;
  this_00 = in_RDI;
  local_20._M_current =
       (GdlExtName *)std::vector<GdlExtName,_std::allocator<GdlExtName>_>::begin(in_RDI);
  local_28 = (GdlExtName *)
             std::vector<GdlExtName,_std::allocator<GdlExtName>_>::end
                       ((vector<GdlExtName,_std::allocator<GdlExtName>_> *)in_RDI);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<GdlExtName_*,_std::vector<GdlExtName,_std::allocator<GdlExtName>_>_>
                        *)this_00,
                       (__normal_iterator<GdlExtName_*,_std::vector<GdlExtName,_std::allocator<GdlExtName>_>_>
                        *)in_RDI);
    if (!bVar1) {
      std::__cxx11::wstring::wstring((wstring *)in_RDI);
      return this_00;
    }
    __gnu_cxx::
    __normal_iterator<GdlExtName_*,_std::vector<GdlExtName,_std::allocator<GdlExtName>_>_>::
    operator*(&local_20);
    GdlExtName::GdlExtName
              (in_stack_ffffffffffffff80,
               (GdlExtName *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    if ((local_30 == 0x409) || (local_30 == 0)) {
      std::__cxx11::wstring::wstring((wstring *)in_RDI,local_50);
      in_stack_ffffffffffffff78 = 1;
    }
    else {
      in_stack_ffffffffffffff78 = 0;
    }
    GdlExtName::~GdlExtName(this_00);
    if (in_stack_ffffffffffffff78 != 0) break;
    __gnu_cxx::
    __normal_iterator<GdlExtName_*,_std::vector<GdlExtName,_std::allocator<GdlExtName>_>_>::
    operator++(&local_20);
  }
  return this_00;
}

Assistant:

std::wstring GdlFeatureSetting::FindBasicExtName() // find an English or language-neutral label
{
	for (auto const extname: m_vextname)
	{
		if (extname.m_wLanguageID == 1033
				|| extname.m_wLanguageID == 0)
			return extname.m_stuName;
	}
	return std::wstring();
}